

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall ON_BinaryArchive::WriteArray(ON_BinaryArchive *this,int count,ON_Layer *a)

{
  bool local_31;
  bool local_25;
  int local_24;
  bool rc;
  int i;
  ON_Layer *a_local;
  int count_local;
  ON_BinaryArchive *this_local;
  
  if ((count < 0) || (a_local._4_4_ = count, a == (ON_Layer *)0x0)) {
    a_local._4_4_ = 0;
  }
  local_25 = WriteInt(this,a_local._4_4_);
  local_24 = 0;
  while( true ) {
    local_31 = false;
    if (local_24 < a_local._4_4_) {
      local_31 = local_25;
    }
    if (local_31 == false) break;
    local_25 = WriteObject(this,(ON_Object *)(a + local_24));
    local_24 = local_24 + 1;
  }
  return local_25;
}

Assistant:

bool ON_BinaryArchive::WriteArray( int count, const ON_Layer* a)
{
  int i;
  if ( count < 0 || 0 == a )
    count = 0;
  bool rc = WriteInt( count );
  for  ( i = 0; i < count && rc; i++ )
  {
    rc = WriteObject(a[i]);
  }
  return rc;
}